

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O1

Error __thiscall asmjit::X86RAPass::emitLoad(X86RAPass *this,VirtReg *vReg,uint32_t id,char *reason)

{
  CodeBuilder *emitter;
  uint32_t signature;
  Error EVar1;
  char *comment;
  X86Reg dst;
  X86Mem src;
  anon_union_16_7_ed616b9d_for_Operand__0 local_40;
  anon_union_16_7_ed616b9d_for_Operand__0 local_30;
  
  if ((this->super_RAPass)._emitComments == '\0') {
    comment = (char *)0x0;
  }
  else {
    StringBuilder::setFormat
              (&(this->_stringBuilder).super_StringBuilder,"[%s] %s",reason,vReg->_name);
    comment = (this->_stringBuilder).super_StringBuilder._data;
  }
  local_40._4_4_ = id;
  local_40._0_4_ = (vReg->_regInfo)._signature;
  local_40._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0x0;
  if (vReg->_memCell == (RACell *)0x0) {
    RAPass::_newVarCell(&this->super_RAPass,vReg);
  }
  emitter = (this->super_RAPass).super_CBPass._cb;
  local_30._any.reserved12_4 = vReg->_id;
  local_30._packed[0] =
       (UInt64)((ulong)((emitter->super_CodeEmitter)._nativeGpReg.super_Operand.super_Operand_.
                        field_0._any.signature & 0xf8) | 0xffffffff00008002);
  local_30._any.reserved8_4 = 0;
  EVar1 = X86Internal::emitRegMove
                    ((X86Emitter *)emitter,(Operand_ *)&local_40._any,(Operand_ *)&local_30._any,
                     (uint)vReg->_typeId,this->_avxEnabled,comment);
  return EVar1;
}

Assistant:

Error X86RAPass::emitLoad(VirtReg* vReg, uint32_t id, const char* reason) {
  const char* comment = nullptr;
  if (_emitComments) {
    _stringBuilder.setFormat("[%s] %s", reason, vReg->getName());
    comment = _stringBuilder.getData();
  }

  X86Reg dst(X86Reg::fromSignature(vReg->getSignature(), id));
  X86Mem src(getVarMem(vReg));
  return X86Internal::emitRegMove(reinterpret_cast<X86Emitter*>(cc()), dst, src, vReg->getTypeId(), _avxEnabled, comment);
}